

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void notch::core::internal::gemv<float*,float_const*,float*>
               (float *m_begin,float *m_end,float *x_begin,float *x_end,float *b_begin,float *b_end)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ostream *poVar4;
  invalid_argument *this;
  float fVar5;
  float *row_end;
  float *row_begin;
  float *b;
  size_t r;
  string local_1f8 [48];
  ostringstream local_1c8 [8];
  ostringstream what;
  size_t n;
  size_t rows;
  size_t cols;
  float *b_end_local;
  float *b_begin_local;
  float *x_end_local;
  float *x_begin_local;
  float *m_end_local;
  float *m_begin_local;
  
  uVar1 = ::std::distance<float_const*>(x_begin,x_end);
  uVar2 = ::std::distance<float*>(b_begin,b_end);
  uVar3 = ::std::distance<float*>(m_begin,m_end);
  if (uVar3 != uVar2 * uVar1) {
    ::std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar4 = ::std::operator<<((ostream *)local_1c8,
                               "stl_gemv: incompatible matrix and vector shapes:\n");
    poVar4 = ::std::operator<<(poVar4," matrix size = ");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,uVar3);
    poVar4 = ::std::operator<<(poVar4," vector size = ");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,uVar1);
    poVar4 = ::std::operator<<(poVar4," result size = ");
    ::std::ostream::operator<<(poVar4,uVar2);
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::ostringstream::str();
    ::std::invalid_argument::invalid_argument(this,local_1f8);
    __cxa_throw(this,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
  }
  b = (float *)0x0;
  for (row_begin = b_begin; row_begin != b_end; row_begin = row_begin + 1) {
    fVar5 = ::std::inner_product<float*,float_const*,float>
                      (m_begin + (long)b * uVar1,m_begin + (long)b * uVar1 + uVar1,x_begin,
                       *row_begin);
    *row_begin = fVar5;
    b = (float *)((long)b + 1);
  }
  return;
}

Assistant:

void
INTERNAL_NOBLAS(gemv)(
     Matrix_Iter m_begin, Matrix_Iter m_end,
     VectorX_Iter x_begin, VectorX_Iter x_end,
     VectorB_Iter b_begin, VectorB_Iter b_end) {
    size_t cols = std::distance(x_begin, x_end);
    size_t rows = std::distance(b_begin, b_end);
    size_t n = std::distance(m_begin, m_end);
    if (n != rows * cols) {
        std::ostringstream what;
        what << "stl_gemv: incompatible matrix and vector shapes:\n"
            << " matrix size = " << n
            << " vector size = " << cols
            << " result size = " << rows;
        throw std::invalid_argument(what.str());
    }
    size_t r = 0; // current row number
    for (auto b = b_begin; b != b_end; ++b, ++r) {
        auto row_begin = m_begin + r * cols;
        auto row_end = row_begin + cols;
        *b = std::inner_product(row_begin, row_end, x_begin, *b);
    }
}